

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Gluco::Clause::Clause<Gluco::vec<Gluco::Lit>>
          (Clause *this,vec<Gluco::Lit> *ps,bool use_extra,bool learnt)

{
  Lit *pLVar1;
  ulong uVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  ulong uVar5;
  int i;
  uint uVar6;
  long lVar7;
  
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000009,learnt) << 2);
  uVar6 = (int)CONCAT71(in_register_00000011,use_extra) << 3;
  *(ulong *)&this->header = *(ulong *)&this->header & 0xffffffffffffffe0 | (ulong)uVar6 | uVar5;
  uVar4 = ps->sz;
  *(ulong *)&this->header = CONCAT44(uVar4,uVar6) | uVar5 | 0x80000000;
  pLVar1 = ps->data;
  for (lVar7 = 0; lVar7 < ps->sz; lVar7 = lVar7 + 1) {
    *(int *)(&this[1].header.field_0x0 + lVar7 * 4) = pLVar1[lVar7].x;
  }
  if (use_extra) {
    if (!learnt) {
      uVar5 = *(ulong *)&this->header;
      if ((uVar5 & 8) != 0) {
        uVar2 = 0;
        uVar4 = (uint)(uVar5 >> 0x20);
        uVar3 = 0;
        if (uVar4 != 0 && -1 < (long)uVar5) {
          uVar3 = (ulong)uVar4;
        }
        uVar4 = 0;
        for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
          uVar4 = uVar4 | 1 << ((byte)(&this[1].header.field_0x0)[uVar2 * 4] >> 1 & 0x1f);
        }
        *(uint *)(&this[1].header.field_0x0 + (uVar5 >> 0x20) * 4) = uVar4;
        return;
      }
      __assert_fail("header.has_extra",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SolverTypes.h"
                    ,0xaa,"void Gluco::Clause::calcAbstraction()");
    }
    *(undefined4 *)(&this[1].header.field_0x0 + (ulong)uVar4 * 4) = 0;
  }
  return;
}

Assistant:

Clause(const V& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();
    header.lbd = 0;
    header.canbedel = 1;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
    
        if (header.has_extra){
      if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction(); }
    }